

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSModuleDef * JS_RunModule(JSContext *ctx,char *basename,char *filename)

{
  JSValue fun_obj;
  JSValue v;
  int iVar1;
  JSContext *in_RDI;
  JSValue JVar2;
  JSValue func_obj;
  JSValue ret;
  JSModuleDef *m;
  undefined8 local_78;
  int32_t iVar3;
  JSFreeModuleEnum in_stack_ffffffffffffff9c;
  undefined4 uVar4;
  JSContext *in_stack_ffffffffffffffa0;
  int64_t iVar5;
  JSContext *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  JSContext *in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  local_8 = js_host_resolve_imported_module
                      (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8
                      );
  if (local_8 == (void *)0x0) {
    local_8 = 0.0;
  }
  else {
    iVar1 = js_resolve_module(in_stack_ffffffffffffffa8,(JSModuleDef *)in_stack_ffffffffffffffa0);
    if (iVar1 < 0) {
      js_free_modules(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
      local_8 = 0.0;
    }
    else {
      iVar3 = (int32_t)local_8;
      uVar4 = local_8._4_4_;
      iVar5 = -3;
      JVar2.tag = -3;
      JVar2.u.float64 = local_8;
      JS_DupValue(in_RDI,JVar2);
      fun_obj.u._4_4_ = uVar4;
      fun_obj.u.int32 = iVar3;
      fun_obj.tag = iVar5;
      JVar2 = JS_EvalFunction(local_78,fun_obj);
      iVar1 = JS_IsException(JVar2);
      if (iVar1 == 0) {
        v.u._4_4_ = uVar4;
        v.u.int32 = iVar3;
        v.tag = iVar5;
        JS_FreeValue((JSContext *)JVar2.tag,v);
      }
      else {
        local_8 = 0.0;
      }
    }
  }
  return (JSModuleDef *)local_8;
}

Assistant:

JSModuleDef *JS_RunModule(JSContext *ctx, const char *basename,
                          const char *filename)
{
    JSModuleDef *m;
    JSValue ret, func_obj;
    
    m = js_host_resolve_imported_module(ctx, basename, filename);
    if (!m)
        return NULL;
    
    if (js_resolve_module(ctx, m) < 0) {
        js_free_modules(ctx, JS_FREE_MODULE_NOT_RESOLVED);
        return NULL;
    }

    /* Evaluate the module code */
    func_obj = JS_DupValue(ctx, JS_MKPTR(JS_TAG_MODULE, m));
    ret = JS_EvalFunction(ctx, func_obj);
    if (JS_IsException(ret))
        return NULL;
    JS_FreeValue(ctx, ret);
    return m;
}